

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

CTypeID crec_bit64_type(CTState *cts,cTValue *tv)

{
  CType *pCVar1;
  CTypeID CVar2;
  
  CVar2 = 0;
  if ((tv->field_2).it == 0xfffffff5) {
    pCVar1 = lj_ctype_rawref(cts,(uint)*(ushort *)((ulong)(tv->u32).lo + 6));
    if ((pCVar1->info & 0xf0000000) == 0x50000000) {
      pCVar1 = (CType *)((long)&cts->tab->info + (ulong)((pCVar1->info & 0xffff) << 4));
    }
    if (((pCVar1->info & 0xfc800000) != 0x800000) || (CVar2 = 0xc, pCVar1->size != 8)) {
      CVar2 = 0xb;
    }
  }
  return CVar2;
}

Assistant:

static CTypeID crec_bit64_type(CTState *cts, cTValue *tv)
{
  if (tviscdata(tv)) {
    CType *ct = lj_ctype_rawref(cts, cdataV(tv)->ctypeid);
    if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
    if ((ct->info & (CTMASK_NUM|CTF_BOOL|CTF_FP|CTF_UNSIGNED)) ==
	CTINFO(CT_NUM, CTF_UNSIGNED) && ct->size == 8)
      return CTID_UINT64;  /* Use uint64_t, since it has the highest rank. */
    return CTID_INT64;  /* Otherwise use int64_t. */
  }
  return 0;  /* Use regular 32 bit ops. */
}